

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O0

void cm_zlib__tr_stored_block(deflate_state *s,charf *buf,ulg stored_len,int eof)

{
  uint uVar1;
  int val;
  int len;
  int eof_local;
  ulg stored_len_local;
  charf *buf_local;
  deflate_state *s_local;
  
  if (s->bi_valid < 0xe) {
    s->bi_buf = s->bi_buf | (ushort)(eof << ((byte)s->bi_valid & 0x1f));
    s->bi_valid = s->bi_valid + 3;
  }
  else {
    s->bi_buf = s->bi_buf | (ushort)(eof << ((byte)s->bi_valid & 0x1f));
    uVar1 = s->pending;
    s->pending = uVar1 + 1;
    s->pending_buf[uVar1] = (Bytef)s->bi_buf;
    uVar1 = s->pending;
    s->pending = uVar1 + 1;
    s->pending_buf[uVar1] = (Bytef)(s->bi_buf >> 8);
    s->bi_buf = (ush)((int)(eof & 0xffffU) >> (0x10U - (char)s->bi_valid & 0x1f));
    s->bi_valid = s->bi_valid + -0xd;
  }
  copy_block(s,buf,(uint)stored_len,1);
  return;
}

Assistant:

void _tr_stored_block(s, buf, stored_len, eof)
    deflate_state *s;
    charf *buf;       /* input block */
    ulg stored_len;   /* length of input block */
    int eof;          /* true if this is the last block for a file */
{
    send_bits(s, (STORED_BLOCK<<1)+eof, 3);  /* send block type */
#ifdef DEBUG
    s->compressed_len = (s->compressed_len + 3 + 7) & (ulg)~7L;
    s->compressed_len += (stored_len + 4) << 3;
#endif
    copy_block(s, buf, (unsigned)stored_len, 1); /* with header */
}